

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::dump(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *val_00;
  _func_int **pp_Var1;
  pointer pbVar2;
  array_t *paVar3;
  object_t *poVar4;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  _Var5;
  uchar *puVar6;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  _Var7;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  char *pcVar8;
  pointer pcVar9;
  element_type *peVar10;
  pointer pbVar11;
  ulong uVar12;
  uint uVar13;
  const_iterator i_1;
  size_t cnt;
  ulong uVar14;
  uchar *puVar15;
  undefined8 uStack_50;
  
  if (discarded < val->m_type) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/output/serializer.hpp"
                  ,0x16b,
                  "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  switch(val->m_type) {
  case null:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
    pcVar8 = "null";
    break;
  case object:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var1 = peVar10->_vptr_output_adapter_protocol;
    if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
      pcVar8 = "{}";
      goto LAB_00127bb9;
    }
    if (pretty_print) {
      (*pp_Var1[1])(peVar10,"{\n",2);
      uVar13 = current_indent + indent_step;
      uVar12 = (ulong)uVar13;
      uVar14 = (this->indent_string)._M_string_length;
      if (uVar14 < uVar12) {
        std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar14 * '\x02');
      }
      poVar4 = (val->m_value).object;
      _Var5._M_node = (poVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      for (uVar14 = 0; uVar14 < (poVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count - 1;
          uVar14 = uVar14 + 1) {
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])
                  (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
        dump_escaped(this,(string_t *)(_Var5._M_node + 1),ensure_ascii);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\": ",3);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(_Var5._M_node + 2),true,ensure_ascii,indent_step,uVar13);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,",\n",2);
        _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
        poVar4 = (val->m_value).object;
      }
      if ((_Rb_tree_header *)_Var5._M_node == &(poVar4->_M_t)._M_impl.super__Rb_tree_header) {
        __assert_fail("i != val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/output/serializer.hpp"
                      ,0x8a,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      _Var7 = std::
              next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        (_Var5,1);
      if ((_Rb_tree_header *)_Var7._M_node !=
          &(((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
        __assert_fail("std::next(i) == val.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/output/serializer.hpp"
                      ,0x8b,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])
                (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
      dump_escaped(this,(string_t *)(_Var5._M_node + 1),ensure_ascii);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\": ",3);
      dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(_Var5._M_node + 2),true,ensure_ascii,indent_step,uVar13);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar10->_vptr_output_adapter_protocol)(peVar10,10);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      pcVar9 = (this->indent_string)._M_dataplus._M_p;
      goto LAB_00127f04;
    }
    (**pp_Var1)(peVar10,0x7b);
    poVar4 = (val->m_value).object;
    _Var5._M_node = (poVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar14 = 0; uVar14 < (poVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count - 1;
        uVar14 = uVar14 + 1) {
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
      dump_escaped(this,(string_t *)(_Var5._M_node + 1),ensure_ascii);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\":",2);
      dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(_Var5._M_node + 2),false,ensure_ascii,indent_step,current_indent);
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x2c);
      _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
      poVar4 = (val->m_value).object;
    }
    if ((_Rb_tree_header *)_Var5._M_node == &(poVar4->_M_t)._M_impl.super__Rb_tree_header) {
      __assert_fail("i != val.m_value.object->cend()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/output/serializer.hpp"
                    ,0xa6,
                    "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    _Var7 = std::
            next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                      (_Var5,1);
    if ((_Rb_tree_header *)_Var7._M_node !=
        &(((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header) {
      __assert_fail("std::next(i) == val.m_value.object->cend()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/output/serializer.hpp"
                    ,0xa7,
                    "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
    dump_escaped(this,(string_t *)(_Var5._M_node + 1),ensure_ascii);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\":",2);
    dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)(_Var5._M_node + 2),false,ensure_ascii,indent_step,current_indent);
    goto LAB_00127f0a;
  case array:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var1 = peVar10->_vptr_output_adapter_protocol;
    if ((((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (pretty_print) {
        (*pp_Var1[1])(peVar10,"[\n",2);
        uVar13 = indent_step + current_indent;
        uVar12 = (ulong)uVar13;
        uVar14 = (this->indent_string)._M_string_length;
        if (uVar14 < uVar12) {
          std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar14 * '\x02');
        }
        paVar3 = (val->m_value).array;
        for (pbVar11 = (paVar3->
                       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            pbVar2 = (paVar3->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish, pbVar11 != pbVar2 + -1;
            pbVar11 = pbVar11 + 1) {
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar10->_vptr_output_adapter_protocol[1])
                    (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
          dump(this,pbVar11,true,ensure_ascii,indent_step,uVar13);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,",\n",2);
          paVar3 = (val->m_value).array;
        }
        if ((paVar3->
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == pbVar2) {
          __assert_fail("!val.m_value.array->empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/output/serializer.hpp"
                        ,0xd0,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])
                  (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(((val->m_value).string)->_M_string_length - 0x10),true,ensure_ascii,
             indent_step,uVar13);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar10->_vptr_output_adapter_protocol)(peVar10,10);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])
                  (peVar10,(this->indent_string)._M_dataplus._M_p,(ulong)current_indent);
      }
      else {
        (**pp_Var1)(peVar10,0x5b);
        paVar3 = (val->m_value).array;
        pbVar11 = (paVar3->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          pbVar2 = (paVar3->
                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          val_00 = pbVar2 + -1;
          if (pbVar11 == val_00) break;
          dump(this,pbVar11,false,ensure_ascii,indent_step,current_indent);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x2c);
          pbVar11 = pbVar11 + 1;
          paVar3 = (val->m_value).array;
        }
        if ((paVar3->
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == pbVar2) {
          __assert_fail("!val.m_value.array->empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/nlohmann/detail/output/serializer.hpp"
                        ,0xe5,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        dump(this,val_00,false,ensure_ascii,indent_step,current_indent);
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
      uStack_50 = 0x5d;
      goto LAB_00127f16;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
    pcVar8 = "[]";
LAB_00127bb9:
    uStack_50 = 2;
    goto LAB_00127f39;
  case string:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x22);
    dump_escaped(this,(string_t *)(val->m_value).object,ensure_ascii);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
    uStack_50 = 0x22;
    goto LAB_00127f16;
  case boolean:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
    if ((val->m_value).boolean != true) {
      pcVar8 = "false";
LAB_00127f37:
      uStack_50 = 5;
      goto LAB_00127f39;
    }
    pcVar8 = "true";
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_value).number_integer);
    return;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_value).number_unsigned);
    return;
  case number_float:
    dump_float(this,(val->m_value).number_float);
    return;
  case binary:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (!pretty_print) {
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"{\"bytes\":[",10);
      puVar15 = (((val->m_value).binary)->
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar15 != puVar6) {
        for (; puVar15 != puVar6 + -1; puVar15 = puVar15 + 1) {
          dump_integer<unsigned_char,_0>(this,*puVar15);
          peVar10 = (this->o).
                    super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar10->_vptr_output_adapter_protocol)(peVar10,0x2c);
          puVar6 = (uchar *)((val->m_value).string)->_M_string_length;
        }
        dump_integer<unsigned_char,_0>(this,puVar6[-1]);
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"],\"subtype\":",0xc);
      if (((val->m_value).binary)->m_has_subtype == true) {
        dump_integer<unsigned_long,_0>(this,((val->m_value).binary)->m_subtype);
        goto LAB_00127f0a;
      }
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
      pcVar8 = "null}";
      goto LAB_00127f37;
    }
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"{\n",2);
    uVar12 = (ulong)(indent_step + current_indent);
    uVar14 = (this->indent_string)._M_string_length;
    if (uVar14 < uVar12) {
      std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar14 * '\x02');
    }
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])
              (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\"bytes\": [",10);
    puVar15 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
              .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar6 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar15 != puVar6) {
      for (; puVar15 != puVar6 + -1; puVar15 = puVar15 + 1) {
        dump_integer<unsigned_char,_0>(this,*puVar15);
        peVar10 = (this->o).
                  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,", ",2);
        puVar6 = (uchar *)((val->m_value).string)->_M_string_length;
      }
      dump_integer<unsigned_char,_0>(this,puVar6[-1]);
    }
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"],\n",3);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])
              (peVar10,(this->indent_string)._M_dataplus._M_p,uVar12);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"\"subtype\": ",0xb);
    if (((val->m_value).binary)->m_has_subtype == true) {
      dump_integer<unsigned_long,_0>(this,((val->m_value).binary)->m_subtype);
    }
    else {
      peVar10 = (this->o).
                super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,"null",4);
    }
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar10->_vptr_output_adapter_protocol)(peVar10,10);
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pcVar9 = (this->indent_string)._M_dataplus._M_p;
LAB_00127f04:
    (*peVar10->_vptr_output_adapter_protocol[1])(peVar10,pcVar9,(ulong)current_indent);
LAB_00127f0a:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar10->_vptr_output_adapter_protocol;
    uStack_50 = 0x7d;
LAB_00127f16:
    (*UNRECOVERED_JUMPTABLE_00)(peVar10,uStack_50);
    return;
  case discarded:
    peVar10 = (this->o).
              super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar10->_vptr_output_adapter_protocol[1];
    pcVar8 = "<discarded>";
    uStack_50 = 0xb;
    goto LAB_00127f39;
  }
  uStack_50 = 4;
LAB_00127f39:
  (*UNRECOVERED_JUMPTABLE_00)(peVar10,pcVar8,uStack_50);
  return;
}

Assistant:

void dump(const BasicJsonType& val,
              const bool pretty_print,
              const bool ensure_ascii,
              const unsigned int indent_step,
              const unsigned int current_indent = 0)
    {
        switch (val.m_type)
        {
            case value_t::object:
            {
                if (val.m_value.object->empty())
                {
                    o->write_characters("{}", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\": ", 3);
                        dump(i->second, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_characters(indent_string.c_str(), new_indent);
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\": ", 3);
                    dump(i->second, true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_character('{');

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\":", 2);
                        dump(i->second, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\":", 2);
                    dump(i->second, false, ensure_ascii, indent_step, current_indent);

                    o->write_character('}');
                }

                return;
            }

            case value_t::array:
            {
                if (val.m_value.array->empty())
                {
                    o->write_characters("[]", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("[\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        dump(*i, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    o->write_characters(indent_string.c_str(), new_indent);
                    dump(val.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character(']');
                }
                else
                {
                    o->write_character('[');

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        dump(*i, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    dump(val.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

                    o->write_character(']');
                }

                return;
            }

            case value_t::string:
            {
                o->write_character('\"');
                dump_escaped(*val.m_value.string, ensure_ascii);
                o->write_character('\"');
                return;
            }

            case value_t::binary:
            {
                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"bytes\": [", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_characters(", ", 2);
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\n", 3);
                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"subtype\": ", 11);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                    }
                    else
                    {
                        o->write_characters("null", 4);
                    }
                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_characters("{\"bytes\":[", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_character(',');
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\"subtype\":", 12);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                        o->write_character('}');
                    }
                    else
                    {
                        o->write_characters("null}", 5);
                    }
                }
                return;
            }

            case value_t::boolean:
            {
                if (val.m_value.boolean)
                {
                    o->write_characters("true", 4);
                }
                else
                {
                    o->write_characters("false", 5);
                }
                return;
            }

            case value_t::number_integer:
            {
                dump_integer(val.m_value.number_integer);
                return;
            }

            case value_t::number_unsigned:
            {
                dump_integer(val.m_value.number_unsigned);
                return;
            }

            case value_t::number_float:
            {
                dump_float(val.m_value.number_float);
                return;
            }

            case value_t::discarded:
            {
                o->write_characters("<discarded>", 11);
                return;
            }

            case value_t::null:
            {
                o->write_characters("null", 4);
                return;
            }

            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }
    }